

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool duckdb_snappy::Uncompress(Source *compressed,Sink *uncompressed)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint32_t uncompressed_len_00;
  char *pcVar4;
  uint32_t uncompressed_len;
  char c;
  size_t allocated_size;
  SnappyDecompressor decompressor;
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> writer;
  SnappySinkAllocator allocator;
  pointer pDVar3;
  
  decompressor.peeked_ = 0;
  decompressor.eof_ = false;
  decompressor.ip_ = (char *)0x0;
  decompressor.ip_limit_ = (char *)0x0;
  uncompressed_len = 0;
  decompressor.reader_ = compressed;
  bVar1 = SnappyDecompressor::ReadUncompressedLength(&decompressor,&uncompressed_len);
  if (bVar1) {
    pcVar4 = &c;
    iVar2 = (*uncompressed->_vptr_Sink[5])
                      (uncompressed,1,(ulong)uncompressed_len,pcVar4,1,&allocated_size);
    uncompressed_len_00 = (uint32_t)pcVar4;
    pDVar3 = (pointer)CONCAT44(extraout_var,iVar2);
    (*compressed->_vptr_Source[2])(compressed);
    if (allocated_size < uncompressed_len) {
      allocator.blocks_.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      allocator.blocks_.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      allocator.blocks_.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      allocator.dest_ = uncompressed;
      SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::SnappyScatteredWriter
                (&writer,&allocator);
      bVar1 = InternalUncompressAllTags<duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>>
                        (&decompressor,&writer,uncompressed_len,uncompressed_len_00);
      SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::~SnappyScatteredWriter(&writer);
      std::
      _Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ::~_Vector_base(&allocator.blocks_.
                       super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
                     );
    }
    else {
      writer.allocator_.dest_ = (Sink *)pDVar3;
      writer.allocator_.blocks_.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_start = pDVar3;
      writer.allocator_.blocks_.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_finish = pDVar3;
      writer.allocator_.blocks_.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar3;
      bVar1 = InternalUncompressAllTags<duckdb_snappy::SnappyArrayWriter>
                        (&decompressor,(SnappyArrayWriter *)&writer,uncompressed_len,
                         uncompressed_len_00);
      (*uncompressed->_vptr_Sink[2])
                (uncompressed,pDVar3,
                 (long)writer.allocator_.blocks_.
                       super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)writer.allocator_.dest_);
    }
  }
  else {
    bVar1 = false;
  }
  SnappyDecompressor::~SnappyDecompressor(&decompressor);
  return bVar1;
}

Assistant:

bool Uncompress(Source* compressed, Sink* uncompressed) {
  // Read the uncompressed length from the front of the compressed input
  SnappyDecompressor decompressor(compressed);
  uint32_t uncompressed_len = 0;
  if (!decompressor.ReadUncompressedLength(&uncompressed_len)) {
    return false;
  }

  char c;
  size_t allocated_size;
  char* buf = uncompressed->GetAppendBufferVariable(1, uncompressed_len, &c, 1,
                                                    &allocated_size);

  const size_t compressed_len = compressed->Available();
  // If we can get a flat buffer, then use it, otherwise do block by block
  // uncompression
  if (allocated_size >= uncompressed_len) {
    SnappyArrayWriter writer(buf);
    bool result = InternalUncompressAllTags(&decompressor, &writer,
                                            compressed_len, uncompressed_len);
    uncompressed->Append(buf, writer.Produced());
    return result;
  } else {
    SnappySinkAllocator allocator(uncompressed);
    SnappyScatteredWriter<SnappySinkAllocator> writer(allocator);
    return InternalUncompressAllTags(&decompressor, &writer, compressed_len,
                                     uncompressed_len);
  }
}